

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::correctInput(HlslParseContext *this,TQualifier *qualifier)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  EShLanguage EVar5;
  ulong uVar6;
  
  uVar1 = *(ulong *)&qualifier->field_0x8;
  uVar2 = *(ulong *)&qualifier->field_0x24;
  uVar6 = uVar1 & 0x1fffffffffffffff;
  *(ulong *)&qualifier->field_0x8 = uVar6;
  qualifier->field_0x10 = qualifier->field_0x10 & 0xf0;
  qualifier->layoutOffset = -1;
  qualifier->layoutAlign = -1;
  uVar4 = *(ulong *)&qualifier->field_0x1c & 0xffff0000ffc07fff;
  *(ulong *)&qualifier->field_0x1c = uVar4 | 0xffff001f8000;
  *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff00000000;
  qualifier->layoutPushConstant = false;
  EVar5 = (this->super_TParseContextBase).super_TParseVersions.language;
  if (EVar5 == EShLangVertex) {
    uVar6 = uVar1 & 0x1fffc01f1fffffff;
    *(ulong *)&qualifier->field_0x8 = uVar6;
    EVar5 = (this->super_TParseContextBase).super_TParseVersions.language;
  }
  if (EVar5 != EShLangTessEvaluation) {
    uVar6 = uVar6 & 0x1fffefffffffffff;
    *(ulong *)&qualifier->field_0x8 = uVar6;
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment)
    goto LAB_0041ac46;
  }
  uVar6 = uVar6 & 0x1fffd01f1fffffff;
  *(ulong *)&qualifier->field_0x8 = uVar6;
LAB_0041ac46:
  *(ulong *)&qualifier->field_0x1c = uVar4 | 0xff00ffff001f8000;
  *(ulong *)&qualifier->field_0x24 = uVar2 | 0xff7fffffff;
  bVar3 = isInputBuiltIn(this,qualifier);
  if (!bVar3) {
    *(ulong *)&qualifier->field_0x8 = uVar6 & 0xffffffffffff007f;
  }
  return;
}

Assistant:

void HlslParseContext::correctInput(TQualifier& qualifier)
{
    clearUniform(qualifier);
    if (language == EShLangVertex)
        qualifier.clearInterstage();
    if (language != EShLangTessEvaluation)
        qualifier.patch = false;
    if (language != EShLangFragment) {
        qualifier.clearInterpolation();
        qualifier.sample = false;
    }

    qualifier.clearStreamLayout();
    qualifier.clearXfbLayout();

    if (! isInputBuiltIn(qualifier))
        qualifier.builtIn = EbvNone;
}